

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void __thiscall Display::startWindow(Display *this)

{
  bool bVar1;
  runtime_error *prVar2;
  element_type *peVar3;
  Display *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->io);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"OMG io is NULL");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0xc])();
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->io);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"OMG io is NULL");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0xe])(peVar3,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0xf])();
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->io);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"OMG io is NULL");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x10])();
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->io);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"OMG io is NULL");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  checkWindowSize(this);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,0,7);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,1,4,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,2,2,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,3,1,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,4,6,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,5,1,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,6,6,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,7,5,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,8,6,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,10,7,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,0xb,7,1);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,0xc,3,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x11])(peVar3,0xd,2,0);
  peVar3 = std::__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<IODevice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->io);
  (*peVar3->_vptr_IODevice[0x12])(peVar3,10);
  return;
}

Assistant:

void Display::startWindow() {
    if (!io) {
        throw std::runtime_error("OMG io is NULL");
    }
    io->initWindow();
    if (!io) {
        throw std::runtime_error("OMG io is NULL");
    }
    io->setEcho(false);
    io->startColor();
    if (!io) {
        throw std::runtime_error("OMG io is NULL");
    }
    io->startSpecialKeys();

    if (!io) {
        throw std::runtime_error("OMG io is NULL");
    }
    checkWindowSize();

    io->addColor(0, COLOR_WHITE, COLOR_BLACK);
    io->addColor(1, COLOR_BLUE, COLOR_BLACK);
    io->addColor(2, COLOR_GREEN, COLOR_BLACK);
    io->addColor(3, COLOR_RED, COLOR_BLACK);
    io->addColor(4, COLOR_CYAN, COLOR_BLACK);
    io->addColor(5, COLOR_RED, COLOR_BLACK);
    io->addColor(6, COLOR_CYAN, COLOR_BLACK);
    io->addColor(7, COLOR_MAGENTA, COLOR_BLACK);
    io->addColor(8, COLOR_CYAN, COLOR_BLACK);
    io->addColor(10, COLOR_WHITE, COLOR_BLACK);
    io->addColor(11, COLOR_WHITE, COLOR_RED);
    io->addColor(12, COLOR_YELLOW, COLOR_BLACK);
    io->addColor(13, COLOR_GREEN, COLOR_BLACK);

    io->setBackground(10);
}